

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_vec3
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,float **out_array,
              cgltf_size *out_size)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  cgltf_float cVar4;
  int local_54;
  ulong uStack_50;
  int j;
  cgltf_size count;
  int size;
  cgltf_size *out_size_local;
  float **out_array_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  if (tokens[i].type == JSMN_OBJECT) {
    iVar1 = tokens[i].size;
    json_chunk_local._4_4_ = i + 1;
    if (iVar1 < 3) {
      options_local._4_4_ = -1;
    }
    else if (*out_array == (float *)0x0) {
      pfVar3 = (float *)cgltf_calloc(options,4,3);
      *out_array = pfVar3;
      if (*out_array == (float *)0x0) {
        options_local._4_4_ = -2;
      }
      else {
        uStack_50 = 0;
        for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
          if ((tokens[json_chunk_local._4_4_].type == JSMN_STRING) &&
             (tokens[json_chunk_local._4_4_].size != 0)) {
            iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"x");
            if (iVar2 == 0) {
              cVar4 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
              **out_array = cVar4;
              json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
              uStack_50 = uStack_50 + 1;
            }
            else {
              iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"y");
              if (iVar2 == 0) {
                cVar4 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
                (*out_array)[1] = cVar4;
                json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
                uStack_50 = uStack_50 + 1;
              }
              else {
                iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"z");
                if (iVar2 == 0) {
                  cVar4 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
                  (*out_array)[2] = cVar4;
                  json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
                  uStack_50 = uStack_50 + 1;
                }
                else {
                  json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
                }
              }
            }
            if (json_chunk_local._4_4_ < 0) {
              return json_chunk_local._4_4_;
            }
          }
        }
        if (uStack_50 < 3) {
          options_local._4_4_ = -1;
        }
        else {
          *out_size = uStack_50;
          options_local._4_4_ = json_chunk_local._4_4_;
        }
      }
    }
    else {
      options_local._4_4_ = -1;
    }
  }
  else {
    options_local._4_4_ = -1;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_vec3(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, float** out_array, cgltf_size* out_size)
{
	if (tokens[i].type == JSMN_OBJECT) {
		int size = tokens[i].size; ++i;
		if (size < 3) {
			return CGLTF_ERROR_JSON;
		}
		else {
			if (*out_array) {
				return CGLTF_ERROR_JSON;
			}
			*out_array = (float*)cgltf_calloc(options, sizeof(cgltf_float), 3);
			if (!*out_array)
			{
				return CGLTF_ERROR_NOMEM;
			}
		}

		cgltf_size count = 0;
		for (int j = 0; j < size; ++j) {
			if (tokens[i].type != JSMN_STRING || tokens[i].size == 0) {
				continue;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "x") == 0) {
				++i; (*out_array)[0] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "y") == 0) {
				++i; (*out_array)[1] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "z") == 0) {
				++i; (*out_array)[2] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else {
				i = cgltf_skip_json(tokens, i + 1);
			}
			if (i < 0) return i;
		}
		if (count < 3) {
			return CGLTF_ERROR_JSON;
		}
		*out_size = count;
	}
	else {
		return CGLTF_ERROR_JSON;
	}
	return i;
}